

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiPlatformMonitor * ImGui::GetViewportPlatformMonitor(ImGuiViewport *viewport_p)

{
  int i;
  int monitor_idx;
  ImGuiViewportP *viewport;
  ImGuiContext *g;
  ImGuiViewport *viewport_p_local;
  
  i = (int)*(short *)&viewport_p[1].WorkPos.y;
  if ((i < 0) || ((GImGui->PlatformIO).Monitors.Size <= i)) {
    viewport_p_local = (ImGuiViewport *)&GImGui->FallbackMonitor;
  }
  else {
    viewport_p_local =
         (ImGuiViewport *)
         ImVector<ImGuiPlatformMonitor>::operator[](&(GImGui->PlatformIO).Monitors,i);
  }
  return (ImGuiPlatformMonitor *)viewport_p_local;
}

Assistant:

const ImGuiPlatformMonitor* ImGui::GetViewportPlatformMonitor(ImGuiViewport* viewport_p)
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)viewport_p;
    int monitor_idx = viewport->PlatformMonitor;
    if (monitor_idx >= 0 && monitor_idx < g.PlatformIO.Monitors.Size)
        return &g.PlatformIO.Monitors[monitor_idx];
    return &g.FallbackMonitor;
}